

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_unittest.cc
# Opt level: O1

AssertionResult __thiscall
anon_unknown.dwarf_4fab5::IsEqual
          (anon_unknown_dwarf_4fab5 *this,char *test_data,uint32_t digest,char *test_result)

{
  uint *puVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  AssertionResult *pAVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar7;
  string output;
  undefined1 auStack_1c8 [8];
  char *local_1c0;
  char *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  AssertionResult local_190;
  undefined8 uStack_180;
  uint auStack_178 [22];
  ios_base local_120 [112];
  char acStack_b0 [152];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar6
  ;
  
  local_1c0 = test_result;
  local_1b8 = test_data;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  lVar2 = *(long *)(local_190._0_8_ + -0x18);
  if (acStack_b0[lVar2 + 1] == '\0') {
    cVar3 = std::ios::widen((char)auStack_1c8 + (char)lVar2 + '8');
    acStack_b0[lVar2] = cVar3;
    acStack_b0[lVar2 + 1] = '\x01';
  }
  acStack_b0[lVar2] = '0';
  *(undefined8 *)((long)&uStack_180 + *(long *)(local_190._0_8_ + -0x18)) = 8;
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190._0_8_ + -0x18));
  *puVar1 = *puVar1 | 0x200;
  *(uint *)((long)auStack_178 + *(long *)(local_190._0_8_ + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190._0_8_ + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::ios_base::~ios_base(local_120);
  iVar4 = strcmp(local_1b0._M_dataplus._M_p,local_1c0);
  if (iVar4 == 0) {
    AVar7 = testing::AssertionSuccess();
    sVar6 = AVar7.message_.ptr_;
  }
  else {
    testing::AssertionFailure();
    pAVar5 = testing::AssertionResult::operator<<(&local_190,(char (*) [10])"hash of \"");
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_1b8);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [14])"\" incorrect:\n");
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [2])"\t");
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_1b0);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [11])" returned\n");
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [2])"\t");
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_1c0);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [13])" is correct\n");
    testing::AssertionResult::AssertionResult((AssertionResult *)this,pAVar5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_190.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    sVar6.ptr_ = extraout_RDX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    sVar6.ptr_ = extraout_RDX_00;
  }
  AVar7.message_.ptr_ = sVar6.ptr_;
  AVar7._0_8_ = this;
  return AVar7;
}

Assistant:

::testing::AssertionResult IsEqual(const char *test_data,
                                   uint32_t digest,
                                   const char *test_result) {
  std::string output = digest_to_hex(digest);
  if (strcmp(output.c_str(), test_result) == 0) {
    return ::testing::AssertionSuccess();
  } else {
    return ::testing::AssertionFailure()
        << "hash of \"" << test_data << "\" incorrect:\n"
        << "\t" << output << " returned\n"
        << "\t" << test_result << " is correct\n";
  }
}